

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O2

exit_table_type<const_afsm::test::events::null_literal_&> *
afsm::transitions::
state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context::array,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::test::json_parser_def::context::array,unsigned_long>
::exit_table<afsm::test::events::null_literal_const&,0ul>(indexes_tuple<0UL> *param_1)

{
  int iVar1;
  
  if ((exit_table<afsm::test::events::null_literal_const&,0ul>(psst::meta::indexes_tuple<0ul>const&)
       ::_table == '\0') &&
     (iVar1 = __cxa_guard_acquire(&exit_table<afsm::test::events::null_literal_const&,0ul>(psst::meta::indexes_tuple<0ul>const&)
                                   ::_table), iVar1 != 0)) {
    state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::test::json_parser_def::context::array,_unsigned_long>
    ::exit_table<const_afsm::test::events::null_literal_&,_0UL>::_table._M_elems[0].
    super__Function_base._M_functor = (_Any_data)ZEXT816(0);
    state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::test::json_parser_def::context::array,_unsigned_long>
    ::exit_table<const_afsm::test::events::null_literal_&,_0UL>::_table._M_elems[0]._M_invoker =
         std::
         _Function_handler<void_(std::tuple<afsm::state<afsm::test::json_parser_def::context::array::value,_afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_&,_const_afsm::test::events::null_literal_&,_afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_&),_afsm::transitions::detail::final_state_exit_func<0UL>_>
         ::_M_invoke;
    state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::test::json_parser_def::context::array,_unsigned_long>
    ::exit_table<const_afsm::test::events::null_literal_&,_0UL>::_table._M_elems[0].
    super__Function_base._M_manager =
         std::
         _Function_handler<void_(std::tuple<afsm::state<afsm::test::json_parser_def::context::array::value,_afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_&,_const_afsm::test::events::null_literal_&,_afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_&),_afsm::transitions::detail::final_state_exit_func<0UL>_>
         ::_M_manager;
    __cxa_atexit(std::
                 array<std::function<void_(std::tuple<afsm::state<afsm::test::json_parser_def::context::array::value,_afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_&,_const_afsm::test::events::null_literal_&,_afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_&)>,_1UL>
                 ::~array,&state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::test::json_parser_def::context::array,_unsigned_long>
                           ::exit_table<const_afsm::test::events::null_literal_&,_0UL>::_table,
                 &__dso_handle);
    __cxa_guard_release(&exit_table<afsm::test::events::null_literal_const&,0ul>(psst::meta::indexes_tuple<0ul>const&)
                         ::_table);
  }
  return &state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context::array,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>,_afsm::test::json_parser_def::context::array,_unsigned_long>
          ::exit_table<const_afsm::test::events::null_literal_&,_0UL>::_table;
}

Assistant:

static exit_table_type<Event> const&
    exit_table( ::psst::meta::indexes_tuple< Indexes... > const& )
    {
        static exit_table_type<Event> _table {{
            detail::final_state_exit_func<Indexes>{} ...
        }};
        return _table;
    }